

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O0

size_t bucket_capacity(size_t prime)

{
  size_t prime_local;
  size_t local_8;
  
  if (prime < 0x3e) {
    local_8 = bucket_capacity::capacity_primes[prime];
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t bucket_capacity(size_t prime)
{
	static const size_t capacity_primes[] = {
		5UL,
		11UL,
		23UL,
		47UL,
		97UL,
		199UL,
		409UL,
		823UL,
		1741UL,
		3469UL,
		6949UL,
		14033UL,
		28411UL,
		57557UL,
		116731UL,
		236897UL,
		480881UL,
		976369UL,
		1982627UL,
		4026031UL,
		8175383UL,
		16601593UL,
		33712729UL,
		68460391UL,
		139022417UL,
		282312799UL,
		573292817UL,
		1164186217UL,
		2364114217UL,
		4294967291UL,

#if (SIZE_MAX > 0xFFFFFFFF)
		(size_t)8589934583ULL,
		(size_t)17179869143ULL,
		(size_t)34359738337ULL,
		(size_t)68719476731ULL,
		(size_t)137438953447ULL,
		(size_t)274877906899ULL,
		(size_t)549755813881ULL,
		(size_t)1099511627689ULL,
		(size_t)2199023255531ULL,
		(size_t)4398046511093ULL,
		(size_t)8796093022151ULL,
		(size_t)17592186044399ULL,
		(size_t)35184372088777ULL,
		(size_t)70368744177643ULL,
		(size_t)140737488355213ULL,
		(size_t)281474976710597ULL,
		(size_t)562949953421231ULL,
		(size_t)1125899906842597ULL,
		(size_t)2251799813685119ULL,
		(size_t)4503599627370449ULL,
		(size_t)9007199254740881ULL,
		(size_t)18014398509481951ULL,
		(size_t)36028797018963913ULL,
		(size_t)72057594037927931ULL,
		(size_t)144115188075855859ULL,
		(size_t)288230376151711717ULL,
		(size_t)576460752303423433ULL,
		(size_t)1152921504606846883ULL,
		(size_t)2305843009213693951ULL,
		(size_t)4611686018427387847ULL,
		(size_t)9223372036854775783ULL,
		(size_t)18446744073709551557ULL
#endif
	};

	static const size_t capacity_primes_size = sizeof(capacity_primes) / sizeof(capacity_primes[0]);

	if (prime < capacity_primes_size)
	{
		return capacity_primes[prime];
	}

	return 0;
}